

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall hdc::Parser::match(Parser *this,TokenKind kind)

{
  bool bVar1;
  
  bVar1 = lookahead(this,kind);
  if (bVar1) {
    (this->matched)._M_current = (this->current_token)._M_current;
    advance(this);
  }
  return bVar1;
}

Assistant:

bool Parser::match(TokenKind kind) {
    if (lookahead(kind)) {
        matched = current_token;
        advance();
        return true;
    }

    return false;
}